

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

uint8_t * google::protobuf::internal::WireFormatLite::InternalWriteGroup
                    (int field_number,MessageLite *value,uint8_t *target,EpsCopyOutputStream *stream
                    )

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  byte *ptr;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  if (stream->end_ <= target) {
    target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  uVar6 = field_number << 3;
  uVar4 = (ulong)(field_number * 8 + 3);
  if (0x7f < uVar6) {
    do {
      uVar3 = (uint)uVar4;
      *target = (byte)uVar4 | 0x80;
      uVar4 = uVar4 >> 7;
      target = target + 1;
    } while (0x3fff < uVar3);
  }
  *target = (byte)uVar4;
  iVar2 = (*value->_vptr_MessageLite[5])(value,target + 1,stream);
  ptr = (byte *)CONCAT44(extraout_var,iVar2);
  if (stream->end_ <= ptr) {
    ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
  }
  uVar5 = uVar6 | 4;
  uVar3 = uVar5;
  if (0x7f < uVar6) {
    do {
      *ptr = (byte)uVar3 | 0x80;
      uVar5 = uVar3 >> 7;
      ptr = ptr + 1;
      bVar1 = 0x3fff < uVar3;
      uVar3 = uVar5;
    } while (bVar1);
  }
  *ptr = (byte)uVar5;
  return ptr + 1;
}

Assistant:

uint8_t* WireFormatLite::InternalWriteGroup(int field_number,
                                            const MessageLite& value,
                                            uint8_t* target,
                                            io::EpsCopyOutputStream* stream) {
  target = stream->EnsureSpace(target);
  target = WriteTagToArray(field_number, WIRETYPE_START_GROUP, target);
  target = value._InternalSerialize(target, stream);
  target = stream->EnsureSpace(target);
  return WriteTagToArray(field_number, WIRETYPE_END_GROUP, target);
}